

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O0

void cftfsub_128_C(float *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  int l;
  int j3;
  int j2;
  int j1;
  int j;
  float *a_local;
  
  (*cft1st_128)(a);
  (*cftmdl_128)(a);
  for (j2 = 0; j2 < 0x20; j2 = j2 + 2) {
    iVar17 = j2 + 0x20;
    iVar18 = j2 + 0x40;
    iVar19 = j2 + 0x60;
    fVar1 = a[j2];
    fVar2 = a[iVar17];
    fVar3 = a[j2 + 1];
    fVar4 = a[j2 + 0x21];
    fVar5 = a[j2];
    fVar6 = a[iVar17];
    fVar7 = a[j2 + 1];
    fVar8 = a[j2 + 0x21];
    fVar9 = a[iVar18];
    fVar10 = a[iVar19];
    fVar11 = a[j2 + 0x41];
    fVar12 = a[j2 + 0x61];
    fVar13 = a[iVar18];
    fVar14 = a[iVar19];
    fVar15 = a[j2 + 0x41];
    fVar16 = a[j2 + 0x61];
    a[j2] = fVar1 + fVar2 + fVar9 + fVar10;
    a[j2 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
    a[iVar18] = (fVar1 + fVar2) - (fVar9 + fVar10);
    a[j2 + 0x41] = (fVar3 + fVar4) - (fVar11 + fVar12);
    a[iVar17] = (fVar5 - fVar6) - (fVar15 - fVar16);
    a[j2 + 0x21] = (fVar7 - fVar8) + (fVar13 - fVar14);
    a[iVar19] = (fVar5 - fVar6) + (fVar15 - fVar16);
    a[j2 + 0x61] = (fVar7 - fVar8) - (fVar13 - fVar14);
  }
  return;
}

Assistant:

static void cftfsub_128_C(float* a) {
  int j, j1, j2, j3, l;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  cft1st_128(a);
  cftmdl_128(a);
  l = 32;
  for (j = 0; j < l; j += 2) {
    j1 = j + l;
    j2 = j1 + l;
    j3 = j2 + l;
    x0r = a[j] + a[j1];
    x0i = a[j + 1] + a[j1 + 1];
    x1r = a[j] - a[j1];
    x1i = a[j + 1] - a[j1 + 1];
    x2r = a[j2] + a[j3];
    x2i = a[j2 + 1] + a[j3 + 1];
    x3r = a[j2] - a[j3];
    x3i = a[j2 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j2] = x0r - x2r;
    a[j2 + 1] = x0i - x2i;
    a[j1] = x1r - x3i;
    a[j1 + 1] = x1i + x3r;
    a[j3] = x1r + x3i;
    a[j3 + 1] = x1i - x3r;
  }
}